

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedCircularImportComponent_Test::~Importer_isResolvedCircularImportComponent_Test
          (Importer_isResolvedCircularImportComponent_Test *this)

{
  Importer_isResolvedCircularImportComponent_Test *this_local;
  
  ~Importer_isResolvedCircularImportComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedCircularImportComponent)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/circularImport_1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto c = model->component(0);

    EXPECT_FALSE(c->isResolved());

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());

    // It is possible however difficult to make a circular import with components.
    auto importModel = c->importSource()->model();
    importModel->component("c2")->importSource()->model()->component("c3")->importSource()->model()->component("i_am_cyclic")->importSource()->setModel(importModel);

    EXPECT_FALSE(c->isResolved());
    EXPECT_TRUE(model->hasUnresolvedImports());
}